

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLinkMotorLinearDriveline.cpp
# Opt level: O3

void __thiscall
chrono::ChLinkMotorLinearDriveline::IntFromDescriptor
          (ChLinkMotorLinearDriveline *this,uint off_v,ChStateDelta *v,uint off_L,
          ChVectorDynamic<> *L)

{
  int iVar1;
  long *plVar2;
  element_type *peVar3;
  element_type *peVar4;
  element_type *peVar5;
  
  ChLinkMateGeneric::IntFromDescriptor((ChLinkMateGeneric *)this,off_v,v,off_L,L);
  plVar2 = *(long **)&(this->super_ChLinkMotorLinear).field_0x278;
  (**(code **)(*plVar2 + 0x148))(plVar2,off_v,v,off_L,L);
  peVar3 = (this->innershaft2lin).super___shared_ptr<chrono::ChShaft,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  (*(peVar3->super_ChPhysicsItem).super_ChObj._vptr_ChObj[0x29])
            (peVar3,(ulong)(off_v + 1),v,(ulong)off_L,L);
  peVar3 = (this->innershaft2rot).super___shared_ptr<chrono::ChShaft,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  (*(peVar3->super_ChPhysicsItem).super_ChObj._vptr_ChObj[0x29])
            (peVar3,(ulong)(off_v + 2),v,(ulong)off_L,L);
  peVar4 = (this->innerconstraint1lin).
           super___shared_ptr<chrono::ChShaftsBodyTranslation,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  iVar1 = (this->super_ChLinkMotorLinear).super_ChLinkMotor.super_ChLinkMateGeneric.mask.nconstr;
  (*(peVar4->super_ChPhysicsItem).super_ChObj._vptr_ChObj[0x29])
            (peVar4,(ulong)off_v,v,(ulong)(iVar1 + off_L),L);
  peVar4 = (this->innerconstraint2lin).
           super___shared_ptr<chrono::ChShaftsBodyTranslation,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  (*(peVar4->super_ChPhysicsItem).super_ChObj._vptr_ChObj[0x29])
            (peVar4,(ulong)off_v,v,(ulong)(iVar1 + 1 + off_L),L);
  peVar5 = (this->innerconstraint2rot).
           super___shared_ptr<chrono::ChShaftsBody,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  (*(peVar5->super_ChPhysicsItem).super_ChObj._vptr_ChObj[0x29])
            (peVar5,(ulong)off_v,v,(ulong)(iVar1 + 2 + off_L),L);
  return;
}

Assistant:

void ChLinkMotorLinearDriveline::IntFromDescriptor(const unsigned int off_v,
                                     ChStateDelta& v,
                                     const unsigned int off_L,
                                     ChVectorDynamic<>& L) {
    // First, inherit to parent class
    ChLinkMotorLinear::IntFromDescriptor(off_v, v, off_L, L);

    innershaft1lin->IntFromDescriptor(off_v, v, off_L, L);
    innershaft2lin->IntFromDescriptor(off_v + 1, v, off_L, L);
    innershaft2rot->IntFromDescriptor(off_v + 2, v, off_L, L);
    int nc = mask.nconstr;
    innerconstraint1lin->IntFromDescriptor(off_v, v, off_L + nc + 0, L);
    innerconstraint2lin->IntFromDescriptor(off_v, v, off_L + nc + 1, L);
    innerconstraint2rot->IntFromDescriptor(off_v, v, off_L + nc + 2, L);
}